

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::FeatureVectorizer_InputColumn::ByteSizeLong
          (FeatureVectorizer_InputColumn *this)

{
  size_type sVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  
  sVar1 = ((this->inputcolumn_).ptr_)->_M_string_length;
  if (sVar1 == 0) {
    sVar4 = 0;
  }
  else {
    uVar5 = (uint)sVar1 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar1 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->inputdimensions_ != 0) {
    uVar6 = this->inputdimensions_ | 1;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    sVar4 = sVar4 + ((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

inline const ::std::string& GetNoArena() const { return *ptr_; }